

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNuGetGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackNuGetGenerator::SetupGroupComponentVariables(cmCPackNuGetGenerator *this,bool ignoreGroup)

{
  _Rb_tree_node_base *__x;
  cmCPackLog *pcVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  undefined7 in_register_00000031;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string compGUp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  components_2;
  ostringstream cmCPackLog_msg;
  
  if ((int)CONCAT71(in_register_00000031,ignoreGroup) == 0) {
    groups.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    groups.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    groups.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var3 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Packaging component group: ");
      __x = p_Var3 + 1;
      poVar4 = std::operator<<(poVar4,(string *)__x);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNuGetGenerator.cxx"
                      ,0x47,compGUp._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&compGUp);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&groups,(value_type *)__x);
      cmsys::SystemTools::MakeCidentifier((string *)&cmCPackLog_msg,(string *)__x);
      cmsys::SystemTools::UpperCase(&compGUp,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      components_2.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      components_2.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      components_2.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var2 = p_Var3[5]._M_left;
      for (p_Var5 = p_Var3[5]._M_parent; p_Var5 != p_Var2; p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
        std::__cxx11::string::string((string *)&cmCPackLog_msg,*(string **)p_Var5);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &components_2,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &components,"CPACK_NUGET_",&compGUp);
      std::operator+((string *)&cmCPackLog_msg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &components,"_GROUP_COMPONENTS");
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_1e8,&components_2,";");
      cmCPackGenerator::SetOption
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,local_1e8._M_dataplus._M_p)
      ;
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&components);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&components_2);
      std::__cxx11::string::~string((string *)&compGUp);
    }
    if (groups.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        groups.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NUGET_GROUPS",(allocator<char> *)&components);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&compGUp,&groups,";");
      cmCPackGenerator::SetOption
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,compGUp._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&compGUp);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var3 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      if (*(long *)(p_Var3 + 4) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Component <");
        poVar4 = std::operator<<(poVar4,(string *)(p_Var3 + 2));
        poVar4 = std::operator<<(poVar4,"> does not belong to any group, package it separately.");
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackNuGetGenerator.cxx"
                        ,99,compGUp._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&compGUp);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&components,(value_type *)(p_Var3 + 1));
      }
    }
    if (components.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        components.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NUGET_COMPONENTS",(allocator<char> *)&local_1e8);
      cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&compGUp,&components,";");
      cmCPackGenerator::SetOption
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,compGUp._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&compGUp);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&components);
    this_00 = &groups;
  }
  else {
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    components.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&components,
              (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
              _M_node_count);
    for (p_Var3 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
                  *)&cmCPackLog_msg,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
                  *)(p_Var3 + 1));
      std::__cxx11::string::string((string *)&compGUp,(string *)&cmCPackLog_msg);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&components,
                 &compGUp);
      std::__cxx11::string::~string((string *)&compGUp);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
               *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NUGET_COMPONENTS",(allocator<char> *)&local_1e8);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&compGUp,&components,";");
    cmCPackGenerator::SetOption
              (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,compGUp._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&compGUp);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    this_00 = &components;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

void cmCPackNuGetGenerator::SetupGroupComponentVariables(bool ignoreGroup)
{
  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup) {
    std::vector<std::string> groups;
    for (auto const& compG : this->ComponentGroups) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Packaging component group: " << compG.first << std::endl);
      groups.push_back(compG.first);
      auto compGUp =
        cmSystemTools::UpperCase(cmSystemTools::MakeCidentifier(compG.first));

      // Collect components for this group
      std::vector<std::string> components;
      std::transform(begin(compG.second.Components),
                     end(compG.second.Components),
                     std::back_inserter(components),
                     [](cmCPackComponent const* comp) { return comp->Name; });
      this->SetOption("CPACK_NUGET_" + compGUp + "_GROUP_COMPONENTS",
                      cmJoin(components, ";").c_str());
    }
    if (!groups.empty()) {
      this->SetOption("CPACK_NUGET_GROUPS", cmJoin(groups, ";").c_str());
    }

    // Handle Orphan components (components not belonging to any groups)
    std::vector<std::string> components;
    for (auto const& comp : this->Components) {
      // Does the component belong to a group?
      if (comp.second.Group == nullptr) {
        cmCPackLogger(
          cmCPackLog::LOG_VERBOSE,
          "Component <"
            << comp.second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        components.push_back(comp.first);
      }
    }
    if (!components.empty()) {
      this->SetOption("CPACK_NUGET_COMPONENTS",
                      cmJoin(components, ";").c_str());
    }

  } else {
    std::vector<std::string> components;
    components.reserve(this->Components.size());
    std::transform(begin(this->Components), end(this->Components),
                   std::back_inserter(components),
                   [](std::pair<std::string, cmCPackComponent> const& comp) {
                     return comp.first;
                   });
    this->SetOption("CPACK_NUGET_COMPONENTS", cmJoin(components, ";").c_str());
  }
}